

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O1

int CVmObjClass::s_getp_is_int_class(vm_val_t *result,uint *argc)

{
  int iVar1;
  vm_datatype_t vVar2;
  
  if (s_getp_is_int_class(vm_val_t*,unsigned_int*)::desc == '\0') {
    s_getp_is_int_class();
  }
  iVar1 = CVmObject::get_prop_check_argc(result,argc,&s_getp_is_int_class::desc);
  if (iVar1 == 0) {
    vVar2 = VM_NIL;
    if (sp_[-1].typ == VM_OBJ) {
      iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]
                                     [sp_[-1].val.obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff),
                         metaclass_reg_);
      vVar2 = VM_TRUE - (iVar1 == 0);
    }
    result->typ = vVar2;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjClass::s_getp_is_int_class(VMG_ vm_val_t *result, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(result, argc, &desc))
        return TRUE;

    /* return true if we have an object of type intrinsic class */
    vm_val_t *v = G_stk->get(0);
    result->set_logical(v->typ == VM_OBJ && is_intcls_obj(vmg_ v->val.obj));

    /* discard the argument */
    G_stk->discard();

    /* handled */
    return TRUE;
}